

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

Section * mocker::genBssSection(Section *__return_storage_ptr__,Module *irModule)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,".bss","");
  paVar1 = &(__return_storage_ptr__->name).field_2;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->name)._M_dataplus._M_p = local_38;
    (__return_storage_ptr__->name).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (__return_storage_ptr__->name)._M_string_length = local_30;
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&__return_storage_ptr__->lines;
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&__return_storage_ptr__->lines;
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node._M_size
       = 0;
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genBssSection(const ir::Module &irModule) {
  nasm::Section res(".bss");
  return res;
}